

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::TextureCubeLodControlCase::init
          (TextureCubeLodControlCase *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  uint size;
  uint uVar2;
  int iVar3;
  TextureCube *this_00;
  ulong uVar4;
  long extraout_RAX;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  deUint32 step;
  Vec4 local_40;
  
  size = this->m_texSize;
  if (size == 0) {
    uVar6 = 0x20;
  }
  else {
    uVar6 = 0x1f;
    if (size != 0) {
      for (; size >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = uVar6 ^ 0x1f;
  }
  this_00 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube(this_00,((this->super_TestCase).m_context)->m_renderCtx,0x8058,size)
  ;
  uVar6 = 0x1f - uVar6;
  this->m_texture = this_00;
  uVar7 = 0;
  uVar4 = 0;
  if (0 < (int)uVar6) {
    uVar4 = (ulong)uVar6;
  }
  lVar1 = uVar4 * 0x28 + 0x28;
  lVar5 = lVar1;
  do {
    if (size != 0) {
      lVar8 = 0;
      uVar9 = 0;
      iVar3 = 0;
      do {
        uVar2 = 0xff;
        if ((int)uVar9 < 0xff) {
          uVar2 = uVar9;
        }
        if ((int)uVar2 < 1) {
          uVar2 = 0;
        }
        if ((CubeFace)uVar7 < CUBEFACE_LAST) {
          iVar3 = (*(code *)(&DAT_01c3ca70 + *(int *)(&DAT_01c3ca70 + (uVar7 & 0xffffffff) * 4)))
                            (&DAT_01c3ca70,uVar7,
                             &DAT_01c3ca70 + *(int *)(&DAT_01c3ca70 + (uVar7 & 0xffffffff) * 4),
                             uVar2 ^ 0xff);
          return iVar3;
        }
        tcu::TextureCube::allocLevel(&this->m_texture->m_refTexture,(CubeFace)uVar7,iVar3);
        lVar5 = (long)(this->m_texture->m_refTexture).m_access[uVar7].
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        tcu::RGBA::toVec((RGBA *)&local_40);
        tcu::clear((PixelBufferAccess *)(lVar5 + lVar8),&local_40);
        iVar3 = iVar3 + 1;
        uVar9 = uVar9 + (int)(0xff / (long)(int)uVar6);
        lVar8 = lVar8 + 0x28;
        lVar5 = extraout_RAX;
      } while (lVar1 != lVar8);
    }
    uVar7 = uVar7 + 1;
    if (uVar7 == 6) {
      return (int)lVar5;
    }
  } while( true );
}

Assistant:

void TextureCubeLodControlCase::init (void)
{
	const deUint32	format		= GL_RGBA8;
	const int		numLevels	= deLog2Floor32(m_texSize)+1;

	m_texture = new glu::TextureCube(m_context.getRenderContext(), format, m_texSize);

	// Fill texture with colored grid.
	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			deUint32	step		= 0xff / (numLevels-1);
			deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
			deUint32	dec			= 0xff - inc;
			deUint32	rgb			= 0;

			switch (faceNdx)
			{
				case 0: rgb = (inc << 16) | (dec << 8) | 255; break;
				case 1: rgb = (255 << 16) | (inc << 8) | dec; break;
				case 2: rgb = (dec << 16) | (255 << 8) | inc; break;
				case 3: rgb = (dec << 16) | (inc << 8) | 255; break;
				case 4: rgb = (255 << 16) | (dec << 8) | inc; break;
				case 5: rgb = (inc << 16) | (255 << 8) | dec; break;
			}

			deUint32	color		= 0xff000000 | rgb;

			m_texture->getRefTexture().allocLevel((tcu::CubeFace)faceNdx, levelNdx);
			tcu::clear(m_texture->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)faceNdx), tcu::RGBA(color).toVec());
		}
	}
}